

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_matcher.hpp
# Opt level: O3

AssertionResult * __thiscall
iutest::detail::RegexMatcher::operator()
          (AssertionResult *__return_storage_ptr__,RegexMatcher *this,char (*actual) [5])

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  bool bVar3;
  AssertionResult *pAVar4;
  string local_60;
  AssertionResult local_40;
  
  bVar3 = Regex(this,*actual);
  if (bVar3) {
    (__return_storage_ptr__->m_message)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->m_message).field_2;
    (__return_storage_ptr__->m_message)._M_string_length = 0;
    (__return_storage_ptr__->m_message).field_2._M_local_buf[0] = '\0';
    __return_storage_ptr__->m_result = true;
  }
  else {
    paVar1 = &local_40.m_message.field_2;
    local_40.m_message._M_string_length = 0;
    local_40.m_message.field_2._M_local_buf[0] = '\0';
    local_40.m_result = false;
    local_40.m_message._M_dataplus._M_p = (pointer)paVar1;
    WhichIs_abi_cxx11_(&local_60,this);
    pAVar4 = AssertionResult::operator<<(&local_40,&local_60);
    (__return_storage_ptr__->m_message)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->m_message).field_2;
    pcVar2 = (pAVar4->m_message)._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,pcVar2,pcVar2 + (pAVar4->m_message)._M_string_length
              );
    __return_storage_ptr__->m_result = pAVar4->m_result;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_60._M_dataplus._M_p != &local_60.field_2) {
      operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40.m_message._M_dataplus._M_p != paVar1) {
      operator_delete(local_40.m_message._M_dataplus._M_p,
                      CONCAT71(local_40.m_message.field_2._M_allocated_capacity._1_7_,
                               local_40.m_message.field_2._M_local_buf[0]) + 1);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

IUTEST_COND_LIKELY( Regex(actual) )
        {
            return AssertionSuccess();
        }